

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-test.c++
# Opt level: O2

void kj::(anonymous_namespace)::expectRes<kj::String,13ul>
               (EncodingResult<kj::String> *result,char8_t (*expected) [13],bool errors)

{
  undefined7 in_register_00000011;
  bool in_R8B;
  ArrayPtr<const_char> expected_00;
  Array<char> local_28;
  undefined1 local_10;
  
  expected_00.size_ = CONCAT71(in_register_00000011,errors) & 0xffffffff;
  local_28.ptr = (result->super_String).content.ptr;
  local_28.size_ = (result->super_String).content.size_;
  local_28.disposer = (result->super_String).content.disposer;
  (result->super_String).content.ptr = (char *)0x0;
  (result->super_String).content.size_ = 0;
  local_10 = result->hadErrors;
  expected_00.ptr = (char *)0xc;
  expectResImpl<kj::String,char>
            ((_anonymous_namespace_ *)&local_28,(EncodingResult<kj::String> *)expected,expected_00,
             in_R8B);
  Array<char>::~Array(&local_28);
  return;
}

Assistant:

void expectRes(EncodingResult<T> result,
               const char8_t (&expected)[s],
               bool errors = false) {
  expectResImpl(kj::mv(result), arrayPtr(reinterpret_cast<const char*>(expected), s - 1), errors);
}